

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_debug.c
# Opt level: O2

void log_message(int log_level,char *function,char *file,int line,char *template,...)

{
  char *__src;
  char *__src_00;
  char in_AL;
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  undefined8 in_R9;
  undefined8 *puVar4;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [40];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  va_list arg_list;
  char *local_38;
  char *message_str;
  char *output;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  if ((uint)log_level < 5) {
    pcVar3 = "ERROR";
  }
  else if (log_level - 5U < 2) {
    if (!g_log_messages) {
      return;
    }
    pcVar3 = "INFO";
  }
  else {
    if (!g_log_messages) {
      return;
    }
    pcVar3 = "DEBUG";
  }
  message_str = (char *)0x0;
  local_e0 = in_R9;
  create_output_header(&message_str,pcVar3,function,file,line);
  if (message_str == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    local_38 = (char *)0x0;
    local_58 = 0x3000000028;
    arg_list[0]._0_8_ = &stack0x00000008;
    arg_list[0].overflow_arg_area = local_108;
    vasprintf(&local_38,template,&local_58);
    __src = local_38;
    if (local_38 == (char *)0x0) {
      fwrite("vasprintf failed!\n",0x12,1,_stderr);
      fflush(_stderr);
      pcVar3 = (char *)0x0;
    }
    else {
      sVar1 = strlen(local_38);
      __src_00 = message_str;
      sVar2 = strlen(message_str);
      pcVar3 = (char *)malloc(sVar1 + sVar2 + 1);
      if (pcVar3 == (char *)0x0) {
        fwrite("malloc failed!\n",0xf,1,_stderr);
        fflush(_stderr);
        free(local_38);
        pcVar3 = message_str;
        goto LAB_00106e0a;
      }
      *pcVar3 = '\0';
      strcat(pcVar3,__src_00);
      strcat(pcVar3,__src);
      free(__src);
    }
    free(message_str);
    if ((uint)log_level < 5) {
      puVar4 = (undefined8 *)&stderr;
    }
    else {
      puVar4 = (undefined8 *)&stdout;
    }
    fprintf((FILE *)*puVar4,"%s\n",pcVar3);
    fflush((FILE *)*puVar4);
  }
  syslog(log_level,"%s",pcVar3);
LAB_00106e0a:
  free(pcVar3);
  return;
}

Assistant:

void log_message(int log_level,
                 const char *function,
                 const char *file,
                 int line,
                 const char *template, ...) {

    char *message_type = NULL;
    bool log_message;

    switch (log_level) {
        case LOG_EMERG:
        case LOG_ALERT:
        case LOG_CRIT:
        case LOG_ERR:
        case LOG_WARNING:
            message_type = "ERROR";
            log_message = true;
            break;
        case LOG_NOTICE:
        case LOG_INFO:
            message_type = "INFO";
            log_message = get_log_mode();
            break;

        case LOG_DEBUG:
        default:
            message_type = "DEBUG";
            log_message = get_log_mode();
            break;
    }

    if (log_message) {
        char *new_output = NULL;
        char *output = NULL;
        create_output_header(&output, message_type, function, file, line);

        if (output) {
            va_list arg_list;
            char *message_str = NULL;

            va_start(arg_list, template);
            vasprintf(&message_str, template, arg_list);
            va_end(arg_list);

            if (message_str) {
                if ((new_output = malloc(strlen(message_str) + strlen(output) + 1)) != NULL) {
                    new_output[0] = '\0';   // ensures the memory is an empty string
                    strcat(new_output, output);
                    strcat(new_output, message_str);
                    free(message_str);
                    free(output);
                } else {
                    fprintf(stderr, "malloc failed!\n");
                    fflush(stderr);
                    free(message_str);
                    free(output);
                    return;
                }
            } else {
                fprintf(stderr, "vasprintf failed!\n");
                fflush(stderr);
                free(output);
            }

            switch (log_level) {
                case LOG_EMERG:
                case LOG_ALERT:
                case LOG_CRIT:
                case LOG_ERR:
                case LOG_WARNING:
                    fprintf(stderr, "%s\n", new_output);
                    fflush(stderr);
                    break;

                case LOG_NOTICE:
                case LOG_INFO:
                case LOG_DEBUG:
                default:
                    fprintf(stdout, "%s\n", new_output);
                    fflush(stdout);
                    break;
            }
        }

        syslog(log_level, "%s", new_output);

        free(new_output);
    }
}